

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall
mkvparser::Tags::SimpleTag::Parse(SimpleTag *this,IMkvReader *pReader,longlong pos,longlong size)

{
  longlong lVar1;
  longlong lVar2;
  long lVar3;
  SimpleTag *str;
  long stop;
  longlong pos_local;
  SimpleTag *local_50;
  SimpleTag *local_48;
  longlong size_1;
  longlong id;
  
  stop = size + pos;
  local_50 = (SimpleTag *)&this->m_tag_string;
  pos_local = pos;
  local_48 = this;
  while( true ) {
    if (stop <= pos_local) {
      return (ulong)(pos_local == stop) * 2 + -2;
    }
    lVar3 = ParseElementHeader(pReader,&pos_local,stop,&id,&size_1);
    lVar2 = size_1;
    lVar1 = pos_local;
    if (lVar3 < 0) break;
    if (size_1 != 0) {
      str = local_50;
      if (((id == 0x4487) || (str = local_48, id == 0x45a3)) &&
         (lVar3 = UnserializeString(pReader,pos_local,size_1,&str->m_tag_name), lVar3 != 0)) {
        return lVar3;
      }
      pos_local = lVar1 + lVar2;
      if (stop < pos_local) {
        return -2;
      }
    }
  }
  return lVar3;
}

Assistant:

long Tags::SimpleTag::Parse(IMkvReader* pReader, long long pos,
                            long long size) {
  const long long stop = pos + size;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvTagName) {
      status = UnserializeString(pReader, pos, size, m_tag_name);

      if (status)
        return status;
    } else if (id == libwebm::kMkvTagString) {
      status = UnserializeString(pReader, pos, size, m_tag_string);

      if (status)
        return status;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}